

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O1

void __thiscall
duckdb::AlpRDCompressionState<float>::CompressVector(AlpRDCompressionState<float> *this)

{
  atomic<unsigned_long> *paVar1;
  float new_value;
  idx_t iVar2;
  __int_type _Var3;
  bool bVar4;
  pointer pCVar5;
  EXACT_TYPE EVar6;
  idx_t i;
  ulong uVar7;
  idx_t iVar8;
  idx_t i_1;
  
  iVar2 = this->nulls_idx;
  if (iVar2 != 0) {
    if (this->vector_idx != 0) {
      uVar7 = 0;
      do {
        if (uVar7 != this->vector_null_positions[uVar7]) {
          EVar6 = this->input_vector[uVar7];
          goto LAB_0109dadb;
        }
        uVar7 = uVar7 + 1;
      } while (this->vector_idx != uVar7);
    }
    EVar6 = 0;
LAB_0109dadb:
    iVar8 = 0;
    do {
      this->input_vector[this->vector_null_positions[iVar8]] = EVar6;
      iVar8 = iVar8 + 1;
    } while (iVar2 != iVar8);
  }
  alp::AlpRDCompression<float,_false>::Compress(this->input_vector,this->vector_idx,&this->state);
  bVar4 = HasEnoughSpace(this);
  if (!bVar4) {
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar2 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var3 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var3 + iVar2);
  }
  if (this->vector_idx != 0 && this->vector_idx != this->nulls_idx) {
    uVar7 = 0;
    do {
      new_value = (float)this->input_vector[uVar7];
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      BaseStatistics::UpdateNumericStats<float>(&(pCVar5->stats).statistics,new_value);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->vector_idx);
  }
  iVar2 = this->vector_idx;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + iVar2;
  UNLOCK();
  FlushVector(this);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<EXACT_TYPE>(input_vector, vector_null_positions, vector_idx,
			                                                       nulls_idx);
		}
		alp::AlpRDCompression<T, false>::Compress(input_vector, vector_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}
		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				T floating_point_value = Load<T>(const_data_ptr_cast(&input_vector[i]));
				current_segment->stats.statistics.UpdateNumericStats<T>(floating_point_value);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}